

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O2

variable_order_t * __thiscall
merlin::graphical_model::order
          (variable_order_t *__return_storage_ptr__,graphical_model *this,OrderMethod ord_type,
          vector<bool,_std::allocator<bool>_> *var_types)

{
  double dVar1;
  size_t i_00;
  OrderMethod kOType;
  bool bVar2;
  int __n;
  ulong uVar3;
  iterator iVar4;
  long lVar5;
  pointer pmVar6;
  _Base_ptr p_Var7;
  difference_type dVar8;
  pointer pmVar9;
  ulong uVar10;
  long lVar11;
  size_t v;
  size_t i;
  pointer puVar12;
  reference rVar13;
  iterator first;
  variable_order_t maxOrd;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> adj;
  vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
  reverse;
  variable_set sumVars;
  variable_set fix;
  score_map_t scores;
  _Rb_tree_iterator<std::pair<const_double,_unsigned_long>_> local_178;
  OrderMethod local_16c;
  variable_set local_168;
  pair<double,_unsigned_long> local_128;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> local_118;
  _Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
  local_100;
  variable_set local_e8;
  variable_set local_a8;
  ulong local_68;
  _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  local_60;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (__return_storage_ptr__,
             (long)(this->m_vadj).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_vadj).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  if (ord_type.t_ == Random) {
    local_e8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_168.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    local_e8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    local_168.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    local_168.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    for (puVar12 = (pointer)0x0;
        puVar12 < (pointer)((long)(this->m_vadj).
                                  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_vadj).
                                  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5);
        puVar12 = (pointer)((long)puVar12 + 1)) {
      rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](var_types,(size_type)puVar12);
      local_a8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = puVar12;
      if ((*rVar13._M_p & rVar13._M_mask) == 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (&local_e8.m_v,(unsigned_long *)&local_a8);
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (&local_168.m_v,(unsigned_long *)&local_a8);
      }
    }
    std::
    random_shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )local_e8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )local_e8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    std::
    random_shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )local_168.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )local_168.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    lVar5 = (long)local_e8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    puVar12 = (__return_storage_ptr__->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    for (lVar11 = 0; lVar5 != lVar11; lVar11 = lVar11 + 1) {
      puVar12[lVar11] =
           local_e8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[lVar11];
    }
    puVar12 = (__return_storage_ptr__->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    for (lVar11 = 0;
        (long)local_168.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_168.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start >> 3 != lVar11; lVar11 = lVar11 + 1) {
      puVar12[lVar5 + lVar11] =
           local_168.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[lVar11];
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8);
  }
  else {
    mrf(&local_118,this);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
    ::vector((vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
              *)&local_100,
             (long)(this->m_vadj).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_vadj).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_e8);
    local_e8.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.m_d = (vsize *)0x0;
    local_e8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var7 = (_Base_ptr)0x0;
    while( true ) {
      pmVar6 = (this->m_vadj).
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pmVar9 = (this->m_vadj).
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((_Base_ptr)((long)pmVar9 - (long)pmVar6 >> 5) <= p_Var7) break;
      rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](var_types,(size_type)p_Var7);
      if ((*rVar13._M_p & rVar13._M_mask) == 0) {
        dVar1 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[(long)p_Var7];
        uVar3 = (ulong)dVar1;
        local_168.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((long)(dVar1 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3);
        local_168.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)p_Var7;
        variable_set::operator|=(&local_e8,(variable *)&local_168);
      }
      p_Var7 = (_Base_ptr)((long)&p_Var7->_M_color + 1);
    }
    for (puVar12 = (pointer)0x0; puVar12 < (pointer)((long)pmVar9 - (long)pmVar6 >> 5);
        puVar12 = (pointer)((long)puVar12 + 1)) {
      local_168.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)order_score(this,&local_118,(size_t)puVar12,ord_type);
      local_168.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar12;
      iVar4 = std::
              _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
              ::_M_emplace_equal<std::pair<double,unsigned_long>>
                        ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                          *)&local_60,(pair<double,_unsigned_long> *)&local_168);
      local_100._M_impl.super__Vector_impl_data._M_start[(long)puVar12]._M_node = iVar4._M_node;
      pmVar6 = (this->m_vadj).
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pmVar9 = (this->m_vadj).
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    uVar3 = 0;
    local_16c.t_ = ord_type.t_;
    while (uVar3 < (ulong)((long)pmVar9 - (long)pmVar6 >> 5)) {
      local_178._M_node = (_Rb_tree_node_base *)0x0;
      p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if (local_e8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_178._M_node = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        iVar4 = std::
                _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                ::upper_bound(&local_60,
                              (key_type_conflict *)
                              (local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1));
        dVar8 = std::__distance<std::_Rb_tree_iterator<std::pair<double_const,unsigned_long>>>
                          (local_178._M_node,iVar4._M_node);
        __n = randi((int)dVar8);
        std::advance<std::_Rb_tree_iterator<std::pair<double_const,unsigned_long>>,int>
                  (&local_178,__n);
      }
      else {
        for (; (_Rb_tree_header *)p_Var7 != &local_60._M_impl.super__Rb_tree_header;
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
          local_168.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)p_Var7[1]._M_parent;
          dVar1 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [(long)local_168.m_v.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start];
          uVar10 = (ulong)dVar1;
          local_168.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((long)(dVar1 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10);
          bVar2 = variable_set::contains(&local_e8,(variable *)&local_168);
          if (bVar2) {
            local_178._M_node = p_Var7;
            std::
            _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
            ::upper_bound(&local_60,(key_type_conflict *)(p_Var7 + 1));
            break;
          }
        }
      }
      p_Var7 = local_178._M_node[1]._M_parent;
      (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
      _M_impl.super__Vector_impl_data._M_start[uVar3] = (unsigned_long)p_Var7;
      std::
      _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
      ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                          *)&local_60,
                         local_100._M_impl.super__Vector_impl_data._M_start[(long)p_Var7]._M_node);
      dVar1 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[(long)p_Var7];
      uVar10 = (ulong)dVar1;
      local_168.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((long)(dVar1 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10);
      local_168.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)p_Var7;
      variable_set::operator/=(&local_e8,(variable *)&local_168);
      local_68 = uVar3;
      variable_set::variable_set
                (&local_168,
                 local_118.
                 super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
                 _M_impl.super__Vector_impl_data._M_start + (long)p_Var7);
      local_a8.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.m_d = (vsize *)0x0;
      for (lVar5 = 0; kOType.t_ = local_16c.t_,
          lVar5 != (long)local_168.m_v.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_168.m_v.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3; lVar5 = lVar5 + 1) {
        lVar11 = *(long *)((_Rb_tree_color *)
                           local_168.m_v.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + lVar5 * 2);
        variable_set::operator|=
                  (local_118.
                   super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar11,&local_168);
        dVar1 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[(long)p_Var7];
        uVar3 = (ulong)dVar1;
        local_128.second = (long)(dVar1 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
        local_128.first = (double)p_Var7;
        variable_set::operator/=
                  (local_118.
                   super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar11,(variable *)&local_128);
        if ((ulong)((long)local_a8.m_v.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_a8.m_v.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) <
            local_60._M_impl.super__Rb_tree_header._M_node_count) {
          variable_set::operator|=
                    (&local_a8,
                     local_118.
                     super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar11);
        }
      }
      for (lVar5 = 0;
          lVar5 != (long)local_a8.m_v.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_a8.m_v.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3; lVar5 = lVar5 + 1) {
        i_00 = local_a8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar5];
        std::
        _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
        ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                            *)&local_60,
                           local_100._M_impl.super__Vector_impl_data._M_start[i_00]._M_node);
        local_128.first = order_score(this,&local_118,i_00,kOType);
        local_128.second = i_00;
        iVar4 = std::
                _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                ::_M_emplace_equal<std::pair<double,unsigned_long>>
                          ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                            *)&local_60,&local_128);
        local_100._M_impl.super__Vector_impl_data._M_start[i_00]._M_node = iVar4._M_node;
      }
      variable_set::~variable_set(&local_a8);
      variable_set::~variable_set(&local_168);
      pmVar6 = (this->m_vadj).
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pmVar9 = (this->m_vadj).
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar3 = local_68 + 1;
    }
    variable_set::~variable_set(&local_e8);
    std::
    _Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
    ::~_Vector_base(&local_100);
    std::
    _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
    ::~_Rb_tree(&local_60);
    std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector(&local_118);
  }
  return __return_storage_ptr__;
}

Assistant:

variable_order_t order(OrderMethod ord_type, std::vector<bool> var_types) const {
		variable_order_t order;
		order.resize(nvar());

		if (ord_type == OrderMethod::Random) {	// random orders are treated here
			variable_order_t sumOrd, maxOrd;
			for (size_t i = 0; i < nvar(); i++) {
				//   build a list of all the variables
				if (var_types[i] == true) maxOrd.push_back(var(i).label());
				else sumOrd.push_back(var(i).label());
			}

			std::random_shuffle(sumOrd.begin(), sumOrd.end());//   and randomly permute them
			std::random_shuffle(maxOrd.begin(), maxOrd.end());
			size_t i = 0;
			for (size_t j = 0; j < sumOrd.size(); ++j) order[i++] = sumOrd[j];
			for (size_t j = 0; j < maxOrd.size(); ++j) order[i++] = maxOrd[j];
			return order;											//   then return
		}

		std::vector<variable_set> adj = mrf();
		typedef std::pair<double, size_t> node_score_t;
		typedef std::multimap<double, size_t> score_map_t;
		score_map_t scores;
		std::vector<score_map_t::iterator> reverse(nvar());

		// get the sum and max variables
		variable_set sumVars;
		for (size_t v = 0; v < nvar(); ++v) {
			if (var_types[v] == false) sumVars |= var(v);
		}

		// get initial scores
		for (size_t v = 0; v < nvar(); ++v) {
			reverse[v] = scores.insert(node_score_t(order_score(adj, v, ord_type), v));
		}

		// Iterate through, selecting sum variables first
		for (size_t ii = 0; ii < nvar(); ++ii) {// Iterate through, selecting variables

			score_map_t::iterator first, last;
			if (sumVars.size() > 0) { // Choose a random entry from among the smallest sum vars
				for (score_map_t::iterator fi = scores.begin(); fi != scores.end(); ++fi) {
					variable v = var(fi->second);
					if (sumVars.contains(v)) {
						first = fi;
						last = scores.upper_bound(first->first);
						break;
					}
				}
			} else {
				first = scores.begin();// Choose a random entry from among the smallest
				last = scores.upper_bound(first->first);
				std::advance(first, randi(std::distance(first, last)));
			}
			size_t i = first->second;

			order[ii] = var(i).label(); // save its label in the ordering
			scores.erase(reverse[i]);	// remove it from our list
			sumVars /= var(i);
			variable_set vi = adj[i]; // go through adjacent variables (copy: adj may change)
			variable_set fix;					//   and keep track of which need updating
			for (variable_set::const_iterator j = vi.begin(); j != vi.end(); ++j) {
				size_t v = _vindex(*j);
				adj[v] |= vi;             // and update their adjacency structures
				adj[v] /= var(i);
				if (fix.size() < scores.size()) {
					if (ord_type == OrderMethod::MinWidth
							|| ord_type == OrderMethod::WtMinWidth)
						fix |= adj[v]; //var(v);				// (width methods only need v, not nbrs)
					else
						fix |= adj[v];	// come back and recalculate their scores
				}
			}
			for (variable_set::const_iterator j = fix.begin(); j != fix.end(); ++j) {
				size_t jj = j->label();
				scores.erase(reverse[jj]);	// remove and update (score,index) pairs
				reverse[jj] = scores.insert(node_score_t(order_score(adj, jj, ord_type), jj));
			}
		}

		return order;
	}